

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O3

void __thiscall
duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLS::AESStateMBEDTLS(AESStateMBEDTLS *this,string *key)

{
  uchar *puVar1;
  int iVar2;
  _Head_base<0UL,_mbedtls_cipher_context_t_*,_false> ctx;
  mbedtls_cipher_info_t *cipher_info;
  runtime_error local_30 [16];
  runtime_error local_20 [16];
  
  duckdb::EncryptionState::EncryptionState(&this->super_EncryptionState,(string *)0x0);
  (this->super_EncryptionState)._vptr_EncryptionState = (_func_int **)&PTR__AESStateMBEDTLS_02489308
  ;
  this->cipher = GCM;
  ctx._M_head_impl = (mbedtls_cipher_context_t *)operator_new(0x48);
  puVar1 = (uchar *)((long)(ctx._M_head_impl)->iv + 8);
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  (ctx._M_head_impl)->iv_size = 0;
  (ctx._M_head_impl)->unprocessed_len = 0;
  (ctx._M_head_impl)->iv[0] = '\0';
  (ctx._M_head_impl)->iv[1] = '\0';
  (ctx._M_head_impl)->iv[2] = '\0';
  (ctx._M_head_impl)->iv[3] = '\0';
  (ctx._M_head_impl)->iv[4] = '\0';
  (ctx._M_head_impl)->iv[5] = '\0';
  (ctx._M_head_impl)->iv[6] = '\0';
  (ctx._M_head_impl)->iv[7] = '\0';
  (ctx._M_head_impl)->unprocessed_data[0] = '\0';
  (ctx._M_head_impl)->unprocessed_data[1] = '\0';
  (ctx._M_head_impl)->unprocessed_data[2] = '\0';
  (ctx._M_head_impl)->unprocessed_data[3] = '\0';
  (ctx._M_head_impl)->unprocessed_data[4] = '\0';
  (ctx._M_head_impl)->unprocessed_data[5] = '\0';
  (ctx._M_head_impl)->unprocessed_data[6] = '\0';
  (ctx._M_head_impl)->unprocessed_data[7] = '\0';
  puVar1 = (uchar *)((long)(ctx._M_head_impl)->unprocessed_data + 8);
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  (ctx._M_head_impl)->cipher_info = (mbedtls_cipher_info_t *)0x0;
  (ctx._M_head_impl)->key_bitlen = 0;
  (ctx._M_head_impl)->operation = MBEDTLS_DECRYPT;
  (ctx._M_head_impl)->cipher_ctx = (void *)0x0;
  (this->context).
  super_unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>._M_t.
  super___uniq_ptr_impl<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>.
  _M_t.
  super__Tuple_impl<0UL,_mbedtls_cipher_context_t_*,_std::default_delete<mbedtls_cipher_context_t>_>
  .super__Head_base<0UL,_mbedtls_cipher_context_t_*,_false>._M_head_impl = ctx._M_head_impl;
  mbedtls_cipher_init(ctx._M_head_impl);
  cipher_info = GetCipher(this,key->_M_string_length);
  if (cipher_info == (mbedtls_cipher_info_t *)0x0) {
    std::runtime_error::runtime_error(local_20,"Failed to get Cipher");
    std::runtime_error::~runtime_error(local_20);
  }
  iVar2 = mbedtls_cipher_setup
                    ((this->context).
                     super_unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>
                     ._M_t.
                     super___uniq_ptr_impl<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_mbedtls_cipher_context_t_*,_std::default_delete<mbedtls_cipher_context_t>_>
                     .super__Head_base<0UL,_mbedtls_cipher_context_t_*,_false>._M_head_impl,
                     cipher_info);
  if (iVar2 != 0) {
    std::runtime_error::runtime_error(local_30,"Failed to initialize cipher context");
    std::runtime_error::~runtime_error(local_30);
  }
  return;
}

Assistant:

MbedTlsWrapper::AESStateMBEDTLS::AESStateMBEDTLS(const std::string *key) : context(duckdb::make_uniq<mbedtls_cipher_context_t>()) {
	mbedtls_cipher_init(context.get());

	auto cipher_info = GetCipher(key->length());
	if (!cipher_info) {
		runtime_error("Failed to get Cipher");
	}

	if (mbedtls_cipher_setup(context.get(), cipher_info) != 0) {
		runtime_error("Failed to initialize cipher context");
	}
}